

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O2

bool __thiscall
Assimp::B3DImporter::CanRead(B3DImporter *this,string *pFile,IOSystem *param_2,bool param_3)

{
  long lVar1;
  bool bVar2;
  string ext;
  
  lVar1 = std::__cxx11::string::rfind((char)pFile,0x2e);
  if (lVar1 == -1) {
    bVar2 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&ext,(ulong)pFile);
    if (((ext._M_string_length == 3) && ((byte)(*ext._M_dataplus._M_p | 0x20U) == 0x62)) &&
       (ext._M_dataplus._M_p[1] == '3')) {
      bVar2 = (ext._M_dataplus._M_p[2] & 0xdfU) == 0x44;
    }
    else {
      bVar2 = false;
    }
    std::__cxx11::string::~string((string *)&ext);
  }
  return bVar2;
}

Assistant:

bool B3DImporter::CanRead( const std::string& pFile, IOSystem* /*pIOHandler*/, bool /*checkSig*/) const{

    size_t pos=pFile.find_last_of( '.' );
    if( pos==string::npos ) {
        return false;
    }

    string ext=pFile.substr( pos+1 );
    if( ext.size()!=3 ) {
        return false;
    }

    return (ext[0]=='b' || ext[0]=='B') && (ext[1]=='3') && (ext[2]=='d' || ext[2]=='D');
}